

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall presolve::HPresolve::changeColLower(HPresolve *this,HighsInt col,double newLower)

{
  HighsLp *pHVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  HighsInt *pHVar7;
  double oldVarLower;
  
  pHVar1 = this->model;
  if ((pHVar1->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start[col] == kContinuous) {
    pdVar3 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    oldVarLower = pdVar3[col];
  }
  else {
    newLower = ceil(newLower - this->primal_feastol);
    pdVar3 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    oldVarLower = pdVar3[col];
    if ((newLower == oldVarLower) && (!NAN(newLower) && !NAN(oldVarLower))) {
      return;
    }
  }
  pdVar3[col] = newLower;
  lVar5 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[col];
  if (lVar5 != -1) {
    piVar2 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    pHVar7 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar5;
    do {
      HighsLinearSumBounds::updatedVarLower(&this->impliedRowBounds,*pHVar7,col,*pdVar6,oldVarLower)
      ;
      markChangedRow(this,*pHVar7);
      lVar4 = (long)(int)lVar5;
      lVar5 = (long)piVar2[lVar4];
      pHVar7 = pHVar7 + (lVar5 - lVar4);
      pdVar6 = pdVar6 + (lVar5 - lVar4);
    } while (lVar5 != -1);
  }
  return;
}

Assistant:

void HPresolve::changeColLower(HighsInt col, double newLower) {
  if (model->integrality_[col] != HighsVarType::kContinuous) {
    newLower = std::ceil(newLower - primal_feastol);
    if (newLower == model->col_lower_[col]) return;
  }

  double oldLower = model->col_lower_[col];
  model->col_lower_[col] = newLower;
  // printf("tightening lower bound of column %" HIGHSINT_FORMAT " from %.15g to
  // %.15g\n", col,
  //        oldLower, newLower);

  for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
    impliedRowBounds.updatedVarLower(nonzero.index(), col, nonzero.value(),
                                     oldLower);
    markChangedRow(nonzero.index());
  }
}